

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcphuff.c
# Opt level: O0

void encode_mcu_AC_first_prepare
               (JCOEF *block,int *jpeg_natural_order_start,int Sl,int Al,JCOEF *values,size_t *bits)

{
  short sVar1;
  ushort uVar2;
  uint uVar3;
  int iVar4;
  int Sl0;
  size_t zerobits;
  int temp2;
  int temp;
  int k;
  size_t *bits_local;
  JCOEF *values_local;
  int Al_local;
  int Sl_local;
  int *jpeg_natural_order_start_local;
  JCOEF *block_local;
  
  zerobits = 0;
  for (k = 0; k < Sl; k = k + 1) {
    sVar1 = block[jpeg_natural_order_start[k]];
    uVar3 = (uint)sVar1;
    if ((uVar3 != 0) &&
       (iVar4 = (int)(((int)uVar3 >> 0x1f ^ uVar3) - ((int)uVar3 >> 0x1f)) >> ((byte)Al & 0x1f),
       iVar4 != 0)) {
      uVar2 = (ushort)iVar4;
      values[k] = uVar2;
      values[k + 0x40] = uVar2 ^ sVar1 >> 0xf;
      zerobits = 1L << ((byte)k & 0x3f) | zerobits;
    }
  }
  *bits = zerobits;
  return;
}

Assistant:

METHODDEF(void)
encode_mcu_AC_first_prepare(const JCOEF *block,
                            const int *jpeg_natural_order_start, int Sl,
                            int Al, JCOEF *values, size_t *bits)
{
  register int k, temp, temp2;
  size_t zerobits = 0U;
  int Sl0 = Sl;

#if SIZEOF_SIZE_T == 4
  if (Sl0 > 32)
    Sl0 = 32;
#endif

  COMPUTE_ABSVALUES_AC_FIRST(Sl0);

  bits[0] = zerobits;
#if SIZEOF_SIZE_T == 4
  zerobits = 0U;

  if (Sl > 32) {
    Sl -= 32;
    jpeg_natural_order_start += 32;
    values += 32;

    COMPUTE_ABSVALUES_AC_FIRST(Sl);
  }
  bits[1] = zerobits;
#endif
}